

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O2

bool decendingLessThan(pair<QString,_int> *s1,pair<QString,_int> *s2)

{
  bool bVar1;
  
  bVar1 = operator>(&s1->first,&s2->first);
  return bVar1;
}

Assistant:

static bool decendingLessThan(const std::pair<QString, int> &s1, const std::pair<QString, int> &s2)
{
    return s1.first > s2.first;
}